

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FatUtils.h
# Opt level: O3

string * trim(string *__return_storage_ptr__,string s)

{
  int iVar1;
  string *psVar2;
  string *extraout_RAX;
  long in_RDX;
  ulong uVar3;
  ulong *puVar4;
  ulong *puVar5;
  long in_RSI;
  long lVar6;
  ulong uVar7;
  ulong *puVar8;
  ulong *puVar9;
  ulong *local_78;
  ulong local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  undefined8 uStack_60;
  _Alloc_hider local_58;
  string *local_50;
  ulong local_48;
  undefined8 uStack_40;
  string *local_38;
  
  local_78 = (ulong *)&local_68;
  local_38 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char*>((string *)&local_78,in_RSI,in_RDX + in_RSI);
  puVar5 = local_78;
  uVar3 = local_70;
  if (0 < (long)local_70 >> 2) {
    uVar3 = (ulong)((uint)local_70 & 3);
    lVar6 = ((long)local_70 >> 2) + 1;
    uVar7 = local_70;
    do {
      iVar1 = isspace((int)*(char *)((long)puVar5 + (uVar7 - 1)));
      if (iVar1 == 0) {
        puVar8 = (ulong *)((long)puVar5 + uVar7);
        goto LAB_0010f7ed;
      }
      iVar1 = isspace((int)*(char *)((long)puVar5 + (uVar7 - 2)));
      if (iVar1 == 0) {
        puVar8 = (ulong *)((long)puVar5 + (uVar7 - 1));
        goto LAB_0010f7ed;
      }
      iVar1 = isspace((int)*(char *)((long)puVar5 + (uVar7 - 3)));
      if (iVar1 == 0) {
        puVar8 = (ulong *)((long)puVar5 + (uVar7 - 2));
        goto LAB_0010f7ed;
      }
      iVar1 = isspace((int)*(char *)((long)puVar5 + (uVar7 - 4)));
      if (iVar1 == 0) {
        puVar8 = (ulong *)((long)puVar5 + (uVar7 - 3));
        goto LAB_0010f7ed;
      }
      uVar7 = uVar7 - 4;
      lVar6 = lVar6 + -1;
    } while (1 < lVar6);
  }
  puVar4 = (ulong *)((long)puVar5 + uVar3);
  lVar6 = (long)puVar4 - (long)puVar5;
  if (lVar6 == 1) {
LAB_0010f7bc:
    iVar1 = isspace((int)*(char *)((long)puVar4 + -1));
    puVar8 = puVar4;
    if (iVar1 != 0) {
      puVar8 = puVar5;
    }
  }
  else if (lVar6 == 2) {
LAB_0010f7a9:
    iVar1 = isspace((int)*(char *)((long)puVar4 + -1));
    puVar8 = puVar4;
    if (iVar1 != 0) {
      puVar4 = (ulong *)((long)puVar4 + -1);
      goto LAB_0010f7bc;
    }
  }
  else {
    puVar8 = puVar5;
    if ((lVar6 == 3) &&
       (iVar1 = isspace((int)*(char *)((long)puVar4 + -1)), puVar8 = puVar4, iVar1 != 0)) {
      puVar4 = (ulong *)((long)puVar4 + -1);
      goto LAB_0010f7a9;
    }
  }
LAB_0010f7ed:
  psVar2 = (string *)((long)puVar8 - (long)puVar5);
  *(char *)puVar8 = '\0';
  local_58._M_p = (pointer)&local_48;
  if (local_78 == (ulong *)&local_68) {
    uStack_40 = uStack_60;
    puVar5 = &local_48;
  }
  else {
    local_58._M_p = (pointer)local_78;
    puVar5 = local_78;
  }
  local_48 = CONCAT71(uStack_67,local_68);
  local_50 = psVar2;
  local_70 = 0;
  local_68 = 0;
  puVar8 = (ulong *)((long)puVar5 + (long)psVar2);
  puVar4 = puVar5;
  local_78 = (ulong *)&local_68;
  local_58._M_p = (pointer)puVar5;
  if (0 < (long)psVar2 >> 2) {
    puVar4 = (ulong *)((long)puVar5 + ((ulong)psVar2 & 0xfffffffffffffffc));
    lVar6 = ((long)psVar2 >> 2) + 1;
    puVar9 = (ulong *)((long)puVar5 + 3);
    do {
      iVar1 = isspace((int)*(char *)((long)puVar9 + -3));
      if (iVar1 == 0) {
        puVar9 = (ulong *)((long)puVar9 + -3);
        goto LAB_0010f91e;
      }
      iVar1 = isspace((int)*(char *)((long)puVar9 + -2));
      if (iVar1 == 0) {
        puVar9 = (ulong *)((long)puVar9 + -2);
        goto LAB_0010f91e;
      }
      iVar1 = isspace((int)*(char *)((long)puVar9 + -1));
      if (iVar1 == 0) {
        puVar9 = (ulong *)((long)puVar9 + -1);
        goto LAB_0010f91e;
      }
      iVar1 = isspace((int)(char)*puVar9);
      if (iVar1 == 0) goto LAB_0010f91e;
      lVar6 = lVar6 + -1;
      puVar9 = (ulong *)((long)puVar9 + 4);
    } while (1 < lVar6);
  }
  lVar6 = (long)puVar8 - (long)puVar4;
  if (lVar6 == 1) {
LAB_0010f8f7:
    iVar1 = isspace((int)(char)*puVar4);
    puVar9 = puVar4;
    if (iVar1 != 0) {
      puVar9 = puVar8;
    }
LAB_0010f91e:
    if (puVar8 != puVar9) {
      std::__cxx11::string::_M_erase((ulong)&local_58,0);
      goto LAB_0010f943;
    }
  }
  else {
    if (lVar6 == 2) {
LAB_0010f8e6:
      iVar1 = isspace((int)(char)*puVar4);
      puVar9 = puVar4;
      if (iVar1 != 0) {
        puVar4 = (ulong *)((long)puVar4 + 1);
        goto LAB_0010f8f7;
      }
      goto LAB_0010f91e;
    }
    if (lVar6 == 3) {
      iVar1 = isspace((int)(char)*puVar4);
      puVar9 = puVar4;
      if (iVar1 != 0) {
        puVar4 = (ulong *)((long)puVar4 + 1);
        goto LAB_0010f8e6;
      }
      goto LAB_0010f91e;
    }
  }
  local_50 = (string *)0x0;
  *(char *)puVar5 = '\0';
LAB_0010f943:
  psVar2 = local_50;
  (local_38->_M_dataplus)._M_p = (pointer)&local_38->field_2;
  if ((ulong *)local_58._M_p == &local_48) {
    (local_38->field_2)._M_allocated_capacity = local_48;
    *(undefined8 *)((long)&local_38->field_2 + 8) = uStack_40;
  }
  else {
    (local_38->_M_dataplus)._M_p = local_58._M_p;
    (local_38->field_2)._M_allocated_capacity = local_48;
  }
  local_38->_M_string_length = (size_type)local_50;
  local_50 = (string *)0x0;
  local_48 = local_48 & 0xffffffffffffff00;
  if (local_78 != (ulong *)&local_68) {
    local_58._M_p = (pointer)&local_48;
    operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
    psVar2 = extraout_RAX;
  }
  return psVar2;
}

Assistant:

static inline string trim(string s) {
  return ltrim(rtrim(s));
}